

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O1

void Super_WriteLibraryGate(FILE *pFile,Super_Man_t *pMan,Super_Gate_t_conflict *pGate,int Num)

{
  float fVar1;
  long lVar2;
  double dVar3;
  
  fprintf((FILE *)pFile,"%04d  ",(ulong)(uint)Num);
  Extra_PrintBinary(pFile,pGate->uTruth,pMan->nMints);
  fprintf((FILE *)pFile,"   %5.2f",(double)pGate->tDelayMax);
  fwrite("  ",2,1,(FILE *)pFile);
  if (0 < pMan->nVarsMax) {
    lVar2 = 0;
    do {
      fVar1 = pGate->ptDelays[lVar2];
      dVar3 = (double)fVar1;
      if ((fVar1 == -9999.0) && (!NAN(fVar1))) {
        dVar3 = 0.0;
      }
      fprintf((FILE *)pFile," %5.2f",dVar3);
      lVar2 = lVar2 + 1;
    } while (lVar2 < pMan->nVarsMax);
  }
  fprintf((FILE *)pFile,"   %5.2f",(double)pGate->Area);
  fwrite("   ",3,1,(FILE *)pFile);
  Super_WriteLibraryGateName::Buffer[0] = '\0';
  Super_WriteLibraryGateName_rec(pGate,Super_WriteLibraryGateName::Buffer);
  fputs(Super_WriteLibraryGateName::Buffer,(FILE *)pFile);
  fputc(10,(FILE *)pFile);
  return;
}

Assistant:

void Super_WriteLibraryGate( FILE * pFile, Super_Man_t * pMan, Super_Gate_t * pGate, int Num )
{
    int i;
    fprintf( pFile, "%04d  ", Num );                         // the number
    Extra_PrintBinary( pFile, pGate->uTruth, pMan->nMints ); // the truth table
    fprintf( pFile, "   %5.2f", pGate->tDelayMax );          // the max delay
    fprintf( pFile, "  " );                                  
    for ( i = 0; i < pMan->nVarsMax; i++ )                   // the pin-to-pin delays
        fprintf( pFile, " %5.2f", pGate->ptDelays[i]==SUPER_NO_VAR? 0.0 : pGate->ptDelays[i] );  
    fprintf( pFile, "   %5.2f", pGate->Area );               // the area
    fprintf( pFile, "   " );
    fprintf( pFile, "%s", Super_WriteLibraryGateName(pGate) );      // the symbolic expression
    fprintf( pFile, "\n" );
}